

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O2

LevelDetails * __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::StartLevel
          (LevelDetails *__return_storage_ptr__,ValidPolicyGraph *this)

{
  pointer *ppmVar1;
  pointer pmVar2;
  pointer __first;
  mapped_type *this_00;
  _Base_ptr p_Var3;
  ulong uVar4;
  ulong uVar5;
  pointer __result;
  _Rb_tree_header *p_Var6;
  pointer pmVar7;
  pointer pmVar8;
  long lVar9;
  _Tp_alloc_type *__alloc;
  ulong uVar10;
  LevelDetails local_68;
  
  pmVar2 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->levels_).
      super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != pmVar2) {
    for (p_Var3 = pmVar2[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &pmVar2[-1]._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)::std::_Rb_tree_increment(p_Var3)) {
      if (*(char *)&p_Var3[2]._M_parent == '\0') {
        this_00 = ::std::
                  map<bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
                  ::operator[](&(this->current_level_).expected_policy_map,(key_type *)(p_Var3 + 1))
        ;
        ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::push_back
                  (this_00,(value_type *)(p_Var3 + 1));
      }
    }
  }
  ::std::_Rb_tree_header::_Rb_tree_header
            (&(__return_storage_ptr__->expected_policy_map)._M_t._M_impl.super__Rb_tree_header,
             &(this->current_level_).expected_policy_map._M_t._M_impl.super__Rb_tree_header);
  __return_storage_ptr__->has_any_policy = (this->current_level_).has_any_policy;
  pmVar8 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pmVar8 == (this->levels_).
                super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __first = (this->levels_).
              super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pmVar8 - (long)__first == 0x7fffffffffffffe0) {
      ::std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar4 = ((long)pmVar8 - (long)__first) / 0x30;
    uVar5 = 1;
    if (pmVar8 != __first) {
      uVar5 = uVar4;
    }
    uVar10 = uVar5 + uVar4;
    __alloc = (_Tp_alloc_type *)0x2aaaaaaaaaaaaaa;
    if (0x2aaaaaaaaaaaaa9 < uVar10) {
      uVar10 = 0x2aaaaaaaaaaaaaa;
    }
    if (CARRY8(uVar5,uVar4)) {
      uVar10 = 0x2aaaaaaaaaaaaaa;
    }
    if (uVar10 == 0) {
      __result = (pointer)0x0;
    }
    else {
      __result = (pointer)operator_new(uVar10 * 0x30);
    }
    pmVar7 = __result + uVar4;
    p_Var6 = &(pmVar7->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(pmVar7->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
    (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
    (pmVar7->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    pmVar7 = ::std::
             vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
             ::_S_relocate(__first,pmVar8,__result,__alloc);
    pmVar8 = ::std::
             vector<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
             ::_S_relocate(pmVar8,pmVar8,pmVar7 + 1,__alloc);
    lVar9 = (long)(this->levels_).
                  super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__first;
    ::std::
    _Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ::_M_deallocate((_Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
                     *)__first,(pointer)(lVar9 / 0x30),lVar9 % 0x30);
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = __result;
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pmVar8;
    (this->levels_).
    super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar10;
  }
  else {
    p_Var6 = &(pmVar8->_M_t)._M_impl.super__Rb_tree_header;
    *(undefined8 *)&(pmVar8->_M_t)._M_impl = 0;
    *(undefined8 *)&(pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var6->_M_header;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var6->_M_header;
    (pmVar8->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppmVar1 = &(this->levels_).
               super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppmVar1 = *ppmVar1 + 1;
  }
  local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_68.expected_policy_map._M_t._M_impl._0_8_ = 0;
  local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68.has_any_policy = false;
  local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68.expected_policy_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  LevelDetails::operator=(&this->current_level_,&local_68);
  ::std::
  _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>,_std::_Select1st<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>_>_>_>
               *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

LevelDetails StartLevel() {
    // Finish building expected_policy_map for the previous level.
    if (!levels_.empty()) {
      for (const auto &[policy, node] : levels_.back()) {
        if (!node.mapped) {
          current_level_.expected_policy_map[policy].push_back(policy);
        }
      }
    }

    LevelDetails prev_level = std::move(current_level_);
    levels_.emplace_back();
    current_level_ = LevelDetails{};
    return prev_level;
  }